

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# algorithm.hh
# Opt level: O2

void __thiscall
tchecker::algorithms::ndfs::
algorithm_t<tchecker::zg::zg_t,_tchecker::tck_liveness::zg_ndfs::graph_t>::dfs_red
          (algorithm_t<tchecker::zg::zg_t,_tchecker::tck_liveness::zg_ndfs::graph_t> *this,zg_t *ts,
          graph_t *graph,dynamic_bitset<unsigned_long,_std::allocator<unsigned_long>_> *labels,
          stats_t *stats,node_sptr_t *n)

{
  color_t cVar1;
  unsigned_long *puVar2;
  node_t *pnVar3;
  color_t *pcVar4;
  bool *pbVar5;
  _Elt_pointer prVar6;
  int iVar7;
  range_t<tchecker::graph::directed::edge_iterator_t<tchecker::graph::directed::details::outgoing,_tchecker::intrusive_shared_ptr_t<tchecker::make_shared_t<tchecker::graph::reachability::edge_t<tchecker::tck_liveness::zg_ndfs::node_t,_tchecker::tck_liveness::zg_ndfs::edge_t>,_unsigned_long,_1UL>_>_>,_tchecker::graph::directed::edge_iterator_t<tchecker::graph::directed::details::outgoing,_tchecker::intrusive_shared_ptr_t<tchecker::make_shared_t<tchecker::graph::reachability::edge_t<tchecker::tck_liveness::zg_ndfs::node_t,_tchecker::tck_liveness::zg_ndfs::edge_t>,_unsigned_long,_1UL>_>_>_>
  local_c0;
  intrusive_shared_ptr_t<tchecker::make_shared_t<tchecker::graph::reachability::node_t<tchecker::tck_liveness::zg_ndfs::node_t,_tchecker::tck_liveness::zg_ndfs::edge_t>,_unsigned_long,_1UL>_>
  *local_b0;
  graph_t *local_a8;
  node_sptr_t t;
  red_stack_entry_t local_98;
  stack<tchecker::algorithms::ndfs::algorithm_t<tchecker::zg::zg_t,_tchecker::tck_liveness::zg_ndfs::graph_t>::red_stack_entry_t,_std::deque<tchecker::algorithms::ndfs::algorithm_t<tchecker::zg::zg_t,_tchecker::tck_liveness::zg_ndfs::graph_t>::red_stack_entry_t,_std::allocator<tchecker::algorithms::ndfs::algorithm_t<tchecker::zg::zg_t,_tchecker::tck_liveness::zg_ndfs::graph_t>::red_stack_entry_t>_>_>
  stack;
  
  std::
  stack<tchecker::algorithms::ndfs::algorithm_t<tchecker::zg::zg_t,tchecker::tck_liveness::zg_ndfs::graph_t>::red_stack_entry_t,std::deque<tchecker::algorithms::ndfs::algorithm_t<tchecker::zg::zg_t,tchecker::tck_liveness::zg_ndfs::graph_t>::red_stack_entry_t,std::allocator<tchecker::algorithms::ndfs::algorithm_t<tchecker::zg::zg_t,tchecker::tck_liveness::zg_ndfs::graph_t>::red_stack_entry_t>>>
  ::
  stack<std::deque<tchecker::algorithms::ndfs::algorithm_t<tchecker::zg::zg_t,tchecker::tck_liveness::zg_ndfs::graph_t>::red_stack_entry_t,std::allocator<tchecker::algorithms::ndfs::algorithm_t<tchecker::zg::zg_t,tchecker::tck_liveness::zg_ndfs::graph_t>::red_stack_entry_t>>,void>
            (&stack);
  local_b0 = (intrusive_shared_ptr_t<tchecker::make_shared_t<tchecker::graph::reachability::node_t<tchecker::tck_liveness::zg_ndfs::node_t,_tchecker::tck_liveness::zg_ndfs::edge_t>,_unsigned_long,_1UL>_>
              *)&(graph->
                 super_graph_t<tchecker::tck_liveness::zg_ndfs::node_t,_tchecker::tck_liveness::zg_ndfs::edge_t,_tchecker::tck_liveness::zg_ndfs::node_hash_t,_tchecker::tck_liveness::zg_ndfs::node_equal_to_t>
                 ).field_0x50;
  local_a8 = graph;
  tchecker::graph::directed::
  graph_t<tchecker::intrusive_shared_ptr_t<tchecker::make_shared_t<tchecker::graph::reachability::node_t<tchecker::tck_liveness::zg_ndfs::node_t,_tchecker::tck_liveness::zg_ndfs::edge_t>,_unsigned_long,_1UL>_>,_tchecker::intrusive_shared_ptr_t<tchecker::make_shared_t<tchecker::graph::reachability::edge_t<tchecker::tck_liveness::zg_ndfs::node_t,_tchecker::tck_liveness::zg_ndfs::edge_t>,_unsigned_long,_1UL>_>_>
  ::edges<tchecker::graph::directed::details::outgoing>
            ((graph_t<tchecker::intrusive_shared_ptr_t<tchecker::make_shared_t<tchecker::graph::reachability::node_t<tchecker::tck_liveness::zg_ndfs::node_t,_tchecker::tck_liveness::zg_ndfs::edge_t>,_unsigned_long,_1UL>_>,_tchecker::intrusive_shared_ptr_t<tchecker::make_shared_t<tchecker::graph::reachability::edge_t<tchecker::tck_liveness::zg_ndfs::node_t,_tchecker::tck_liveness::zg_ndfs::edge_t>,_unsigned_long,_1UL>_>_>
              *)&local_c0,local_b0);
  red_stack_entry_t::red_stack_entry_t(&local_98,n,&local_c0);
  std::
  deque<tchecker::algorithms::ndfs::algorithm_t<tchecker::zg::zg_t,tchecker::tck_liveness::zg_ndfs::graph_t>::red_stack_entry_t,std::allocator<tchecker::algorithms::ndfs::algorithm_t<tchecker::zg::zg_t,tchecker::tck_liveness::zg_ndfs::graph_t>::red_stack_entry_t>>
  ::
  emplace_back<tchecker::algorithms::ndfs::algorithm_t<tchecker::zg::zg_t,tchecker::tck_liveness::zg_ndfs::graph_t>::red_stack_entry_t>
            ((deque<tchecker::algorithms::ndfs::algorithm_t<tchecker::zg::zg_t,tchecker::tck_liveness::zg_ndfs::graph_t>::red_stack_entry_t,std::allocator<tchecker::algorithms::ndfs::algorithm_t<tchecker::zg::zg_t,tchecker::tck_liveness::zg_ndfs::graph_t>::red_stack_entry_t>>
              *)&stack,&local_98);
  red_stack_entry_t::~red_stack_entry_t(&local_98);
  range_t<tchecker::graph::directed::edge_iterator_t<tchecker::graph::directed::details::outgoing,_tchecker::intrusive_shared_ptr_t<tchecker::make_shared_t<tchecker::graph::reachability::edge_t<tchecker::tck_liveness::zg_ndfs::node_t,_tchecker::tck_liveness::zg_ndfs::edge_t>,_unsigned_long,_1UL>_>_>,_tchecker::graph::directed::edge_iterator_t<tchecker::graph::directed::details::outgoing,_tchecker::intrusive_shared_ptr_t<tchecker::make_shared_t<tchecker::graph::reachability::edge_t<tchecker::tck_liveness::zg_ndfs::node_t,_tchecker::tck_liveness::zg_ndfs::edge_t>,_unsigned_long,_1UL>_>_>_>
  ::~range_t(&local_c0);
  puVar2 = stats_t::visited_states_red(stats);
  *puVar2 = *puVar2 + 1;
  do {
    if (stack.c.
        super__Deque_base<tchecker::algorithms::ndfs::algorithm_t<tchecker::zg::zg_t,_tchecker::tck_liveness::zg_ndfs::graph_t>::red_stack_entry_t,_std::allocator<tchecker::algorithms::ndfs::algorithm_t<tchecker::zg::zg_t,_tchecker::tck_liveness::zg_ndfs::graph_t>::red_stack_entry_t>_>
        ._M_impl.super__Deque_impl_data._M_finish._M_cur ==
        stack.c.
        super__Deque_base<tchecker::algorithms::ndfs::algorithm_t<tchecker::zg::zg_t,_tchecker::tck_liveness::zg_ndfs::graph_t>::red_stack_entry_t,_std::allocator<tchecker::algorithms::ndfs::algorithm_t<tchecker::zg::zg_t,_tchecker::tck_liveness::zg_ndfs::graph_t>::red_stack_entry_t>_>
        ._M_impl.super__Deque_impl_data._M_start._M_cur) break;
    prVar6 = stack.c.
             super__Deque_base<tchecker::algorithms::ndfs::algorithm_t<tchecker::zg::zg_t,_tchecker::tck_liveness::zg_ndfs::graph_t>::red_stack_entry_t,_std::allocator<tchecker::algorithms::ndfs::algorithm_t<tchecker::zg::zg_t,_tchecker::tck_liveness::zg_ndfs::graph_t>::red_stack_entry_t>_>
             ._M_impl.super__Deque_impl_data._M_finish._M_cur;
    if (stack.c.
        super__Deque_base<tchecker::algorithms::ndfs::algorithm_t<tchecker::zg::zg_t,_tchecker::tck_liveness::zg_ndfs::graph_t>::red_stack_entry_t,_std::allocator<tchecker::algorithms::ndfs::algorithm_t<tchecker::zg::zg_t,_tchecker::tck_liveness::zg_ndfs::graph_t>::red_stack_entry_t>_>
        ._M_impl.super__Deque_impl_data._M_finish._M_cur ==
        stack.c.
        super__Deque_base<tchecker::algorithms::ndfs::algorithm_t<tchecker::zg::zg_t,_tchecker::tck_liveness::zg_ndfs::graph_t>::red_stack_entry_t,_std::allocator<tchecker::algorithms::ndfs::algorithm_t<tchecker::zg::zg_t,_tchecker::tck_liveness::zg_ndfs::graph_t>::red_stack_entry_t>_>
        ._M_impl.super__Deque_impl_data._M_finish._M_first) {
      prVar6 = stack.c.
               super__Deque_base<tchecker::algorithms::ndfs::algorithm_t<tchecker::zg::zg_t,_tchecker::tck_liveness::zg_ndfs::graph_t>::red_stack_entry_t,_std::allocator<tchecker::algorithms::ndfs::algorithm_t<tchecker::zg::zg_t,_tchecker::tck_liveness::zg_ndfs::graph_t>::red_stack_entry_t>_>
               ._M_impl.super__Deque_impl_data._M_finish._M_node[-1] + 0x15;
    }
    if (prVar6[-1].current._edge._t == prVar6[-1].end._edge._t) {
      std::
      deque<tchecker::algorithms::ndfs::algorithm_t<tchecker::zg::zg_t,_tchecker::tck_liveness::zg_ndfs::graph_t>::red_stack_entry_t,_std::allocator<tchecker::algorithms::ndfs::algorithm_t<tchecker::zg::zg_t,_tchecker::tck_liveness::zg_ndfs::graph_t>::red_stack_entry_t>_>
      ::pop_back(&stack.c);
LAB_0012f76d:
      iVar7 = 0;
    }
    else {
      red_stack_entry_t::pick_successor((red_stack_entry_t *)&t,(graph_t *)(prVar6 + -1));
      puVar2 = stats_t::visited_transitions_red(stats);
      *puVar2 = *puVar2 + 1;
      pnVar3 = (node_t *)
               intrusive_shared_ptr_t<tchecker::make_shared_t<tchecker::graph::reachability::node_t<tchecker::tck_liveness::zg_ndfs::node_t,_tchecker::tck_liveness::zg_ndfs::edge_t>,_unsigned_long,_1UL>_>
               ::operator->((intrusive_shared_ptr_t<tchecker::make_shared_t<tchecker::graph::reachability::node_t<tchecker::tck_liveness::zg_ndfs::node_t,_tchecker::tck_liveness::zg_ndfs::edge_t>,_unsigned_long,_1UL>_>
                             *)&t);
      pcVar4 = ndfs::node_t::color(pnVar3);
      cVar1 = *pcVar4;
      if (cVar1 == CYAN) {
        pbVar5 = stats_t::cycle(stats);
        *pbVar5 = true;
        iVar7 = 3;
      }
      else {
        pnVar3 = (node_t *)
                 intrusive_shared_ptr_t<tchecker::make_shared_t<tchecker::graph::reachability::node_t<tchecker::tck_liveness::zg_ndfs::node_t,_tchecker::tck_liveness::zg_ndfs::edge_t>,_unsigned_long,_1UL>_>
                 ::operator->((intrusive_shared_ptr_t<tchecker::make_shared_t<tchecker::graph::reachability::node_t<tchecker::tck_liveness::zg_ndfs::node_t,_tchecker::tck_liveness::zg_ndfs::edge_t>,_unsigned_long,_1UL>_>
                               *)&t);
        pcVar4 = ndfs::node_t::color(pnVar3);
        iVar7 = 0;
        if (*pcVar4 == BLUE) {
          pnVar3 = (node_t *)
                   intrusive_shared_ptr_t<tchecker::make_shared_t<tchecker::graph::reachability::node_t<tchecker::tck_liveness::zg_ndfs::node_t,_tchecker::tck_liveness::zg_ndfs::edge_t>,_unsigned_long,_1UL>_>
                   ::operator->((intrusive_shared_ptr_t<tchecker::make_shared_t<tchecker::graph::reachability::node_t<tchecker::tck_liveness::zg_ndfs::node_t,_tchecker::tck_liveness::zg_ndfs::edge_t>,_unsigned_long,_1UL>_>
                                 *)&t);
          pcVar4 = ndfs::node_t::color(pnVar3);
          *pcVar4 = RED;
          tchecker::graph::directed::
          graph_t<tchecker::intrusive_shared_ptr_t<tchecker::make_shared_t<tchecker::graph::reachability::node_t<tchecker::tck_liveness::zg_ndfs::node_t,_tchecker::tck_liveness::zg_ndfs::edge_t>,_unsigned_long,_1UL>_>,_tchecker::intrusive_shared_ptr_t<tchecker::make_shared_t<tchecker::graph::reachability::edge_t<tchecker::tck_liveness::zg_ndfs::node_t,_tchecker::tck_liveness::zg_ndfs::edge_t>,_unsigned_long,_1UL>_>_>
          ::edges<tchecker::graph::directed::details::outgoing>
                    ((graph_t<tchecker::intrusive_shared_ptr_t<tchecker::make_shared_t<tchecker::graph::reachability::node_t<tchecker::tck_liveness::zg_ndfs::node_t,_tchecker::tck_liveness::zg_ndfs::edge_t>,_unsigned_long,_1UL>_>,_tchecker::intrusive_shared_ptr_t<tchecker::make_shared_t<tchecker::graph::reachability::edge_t<tchecker::tck_liveness::zg_ndfs::node_t,_tchecker::tck_liveness::zg_ndfs::edge_t>,_unsigned_long,_1UL>_>_>
                      *)&local_c0,local_b0);
          red_stack_entry_t::red_stack_entry_t(&local_98,&t,&local_c0);
          std::
          deque<tchecker::algorithms::ndfs::algorithm_t<tchecker::zg::zg_t,tchecker::tck_liveness::zg_ndfs::graph_t>::red_stack_entry_t,std::allocator<tchecker::algorithms::ndfs::algorithm_t<tchecker::zg::zg_t,tchecker::tck_liveness::zg_ndfs::graph_t>::red_stack_entry_t>>
          ::
          emplace_back<tchecker::algorithms::ndfs::algorithm_t<tchecker::zg::zg_t,tchecker::tck_liveness::zg_ndfs::graph_t>::red_stack_entry_t>
                    ((deque<tchecker::algorithms::ndfs::algorithm_t<tchecker::zg::zg_t,tchecker::tck_liveness::zg_ndfs::graph_t>::red_stack_entry_t,std::allocator<tchecker::algorithms::ndfs::algorithm_t<tchecker::zg::zg_t,tchecker::tck_liveness::zg_ndfs::graph_t>::red_stack_entry_t>>
                      *)&stack,&local_98);
          red_stack_entry_t::~red_stack_entry_t(&local_98);
          range_t<tchecker::graph::directed::edge_iterator_t<tchecker::graph::directed::details::outgoing,_tchecker::intrusive_shared_ptr_t<tchecker::make_shared_t<tchecker::graph::reachability::edge_t<tchecker::tck_liveness::zg_ndfs::node_t,_tchecker::tck_liveness::zg_ndfs::edge_t>,_unsigned_long,_1UL>_>_>,_tchecker::graph::directed::edge_iterator_t<tchecker::graph::directed::details::outgoing,_tchecker::intrusive_shared_ptr_t<tchecker::make_shared_t<tchecker::graph::reachability::edge_t<tchecker::tck_liveness::zg_ndfs::node_t,_tchecker::tck_liveness::zg_ndfs::edge_t>,_unsigned_long,_1UL>_>_>_>
          ::~range_t(&local_c0);
          puVar2 = stats_t::visited_states_red(stats);
          *puVar2 = *puVar2 + 1;
        }
      }
      intrusive_shared_ptr_t<tchecker::make_shared_t<tchecker::graph::reachability::node_t<tchecker::tck_liveness::zg_ndfs::node_t,_tchecker::tck_liveness::zg_ndfs::edge_t>,_unsigned_long,_1UL>_>
      ::~intrusive_shared_ptr_t
                ((intrusive_shared_ptr_t<tchecker::make_shared_t<tchecker::graph::reachability::node_t<tchecker::tck_liveness::zg_ndfs::node_t,_tchecker::tck_liveness::zg_ndfs::edge_t>,_unsigned_long,_1UL>_>
                  *)&t);
      if (cVar1 != CYAN) goto LAB_0012f76d;
    }
  } while (iVar7 == 0);
  std::
  deque<tchecker::algorithms::ndfs::algorithm_t<tchecker::zg::zg_t,_tchecker::tck_liveness::zg_ndfs::graph_t>::red_stack_entry_t,_std::allocator<tchecker::algorithms::ndfs::algorithm_t<tchecker::zg::zg_t,_tchecker::tck_liveness::zg_ndfs::graph_t>::red_stack_entry_t>_>
  ::~deque(&stack.c);
  return;
}

Assistant:

void dfs_red(TS & ts, GRAPH & graph, boost::dynamic_bitset<> const & labels, tchecker::algorithms::ndfs::stats_t & stats,
               node_sptr_t & n)
  {
    std::stack<red_stack_entry_t> stack;

    stack.push(red_stack_entry_t{n, graph.outgoing_edges(n)});
    ++stats.visited_states_red();

    while (!stack.empty()) {
      red_stack_entry_t & top = stack.top();
      if (!top.has_successor())
        stack.pop();
      else {
        node_sptr_t t = top.pick_successor(graph);
        ++stats.visited_transitions_red();
        if (t->color() == tchecker::algorithms::ndfs::CYAN) {
          stats.cycle() = true;
          break;
        }
        else if (t->color() == tchecker::algorithms::ndfs::BLUE) {
          t->color() = tchecker::algorithms::ndfs::RED;
          stack.push(red_stack_entry_t{t, graph.outgoing_edges(t)});
          ++stats.visited_states_red();
        }
      }
    }
  }